

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RAWToYJRow_C(uint8_t *src_argb0,uint8_t *dst_y,int width)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar3;
  }
  for (; (int)uVar2 != (int)uVar3; uVar3 = uVar3 + 1) {
    iVar1 = libyuv::RGBToYJ(*src_argb0,src_argb0[1],src_argb0[2]);
    dst_y[uVar3] = (uint8_t)iVar1;
    src_argb0 = src_argb0 + 3;
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}